

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O1

void apply_sharpen(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float sharpness_val)

{
  pointer pMVar1;
  Mat *pMVar2;
  ostream *poVar3;
  Mat *img;
  pointer pMVar4;
  Mat sharpeningKernel;
  Mat *local_1b8;
  Mat *local_1b0;
  Mat *local_1a8;
  uchar *local_1a0;
  Mat *local_198;
  float local_18c;
  MatConstIterator local_188;
  double local_160;
  undefined8 local_158;
  uint local_150 [2];
  pointer local_148;
  undefined8 local_140;
  undefined4 local_f0 [2];
  pointer local_e8;
  undefined8 uStack_e0;
  Mat local_90 [96];
  
  local_18c = sharpness_val;
  cv::Mat::Mat((Mat *)local_f0,3,3,6);
  cv::MatConstIterator::MatConstIterator(&local_188,(Mat *)local_f0);
  *(double *)local_188.ptr = 0.0;
  pMVar2 = (Mat *)local_188.ptr;
  if ((CONCAT44(local_188.m._4_4_,local_188.m._0_4_) != 0) &&
     (pMVar2 = (Mat *)(local_188.elemSize + (long)local_188.ptr),
     local_188.sliceEnd <= (Mat *)(local_188.elemSize + (long)local_188.ptr))) {
    cv::MatConstIterator::seek((long)&local_188,true);
    pMVar2 = (Mat *)local_188.ptr;
  }
  local_188.ptr = (uchar *)pMVar2;
  local_1b8 = (Mat *)CONCAT44(local_188.m._4_4_,local_188.m._0_4_);
  local_1b0 = (Mat *)local_188.elemSize;
  local_1a8 = (Mat *)local_188.ptr;
  local_1a0 = local_188.sliceStart;
  local_198 = (Mat *)local_188.sliceEnd;
  *(double *)local_188.ptr = 0.0;
  if ((local_1b8 != (Mat *)0x0) &&
     (local_1a8 = (Mat *)(local_188.elemSize + (long)local_188.ptr), local_188.sliceEnd <= local_1a8
     )) {
    local_1a8 = (Mat *)local_188.ptr;
    cv::MatConstIterator::seek((long)&local_1b8,true);
  }
  *(double *)local_1a8 = 0.0;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  *(double *)local_1a8 = 0.0;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  local_160 = (double)local_18c;
  *(double *)local_1a8 = local_160;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  *(double *)local_1a8 = 0.0;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  *(double *)local_1a8 = 0.0;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  *(double *)local_1a8 = 0.0;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  *(double *)local_1a8 = 0.0;
  pMVar2 = local_1a8;
  if ((local_1b8 != (Mat *)0x0) &&
     (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
    cv::MatConstIterator::seek((long)&local_1b8,true);
    pMVar2 = local_1a8;
  }
  local_1a8 = pMVar2;
  cv::Mat::Mat((Mat *)local_150);
  local_150[0] = local_150[0] & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)local_150,local_1b8);
  cv::Mat::Mat(local_90,(Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_f0);
  if ((local_18c != 1.0) || (NAN(local_18c))) {
    cv::Mat::Mat((Mat *)local_f0,3,3,6);
    cv::MatConstIterator::MatConstIterator(&local_188,(Mat *)local_f0);
    *(double *)local_188.ptr = -1.0;
    pMVar2 = (Mat *)local_188.ptr;
    if ((CONCAT44(local_188.m._4_4_,local_188.m._0_4_) != 0) &&
       (pMVar2 = (Mat *)(local_188.elemSize + (long)local_188.ptr),
       local_188.sliceEnd <= (Mat *)(local_188.elemSize + (long)local_188.ptr))) {
      cv::MatConstIterator::seek((long)&local_188,true);
      pMVar2 = (Mat *)local_188.ptr;
    }
    local_188.ptr = (uchar *)pMVar2;
    local_1b8 = (Mat *)CONCAT44(local_188.m._4_4_,local_188.m._0_4_);
    local_1b0 = (Mat *)local_188.elemSize;
    local_1a8 = (Mat *)local_188.ptr;
    local_1a0 = local_188.sliceStart;
    local_198 = (Mat *)local_188.sliceEnd;
    *(double *)local_188.ptr = -1.0;
    if ((local_1b8 != (Mat *)0x0) &&
       (local_1a8 = (Mat *)(local_188.elemSize + (long)local_188.ptr),
       local_188.sliceEnd <= local_1a8)) {
      local_1a8 = (Mat *)local_188.ptr;
      cv::MatConstIterator::seek((long)&local_1b8,true);
    }
    *(double *)local_1a8 = -1.0;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    *(double *)local_1a8 = -1.0;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    *(double *)local_1a8 = local_160;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    *(double *)local_1a8 = -1.0;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    *(double *)local_1a8 = -1.0;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    *(double *)local_1a8 = -1.0;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    *(double *)local_1a8 = -1.0;
    pMVar2 = local_1a8;
    if ((local_1b8 != (Mat *)0x0) &&
       (pMVar2 = local_1b0 + (long)local_1a8, local_198 <= local_1b0 + (long)local_1a8)) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar2 = local_1a8;
    }
    local_1a8 = pMVar2;
    cv::Mat::Mat((Mat *)local_150);
    local_150[0] = local_150[0] & 0xfffff000 | 6;
    cv::Mat_<double>::operator=((Mat_<double> *)local_150,local_1b8);
    cv::Mat::operator=(local_90,(Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_f0);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::blue_abi_cxx11_,DAT_00159610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Changing Sharpness : ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,color::reset_abi_cxx11_,DAT_00159670);
  pMVar4 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    do {
      local_140 = 0;
      local_150[0] = 0x1010000;
      uStack_e0 = 0;
      local_f0[0] = 0x2010000;
      local_188.ptr = (uchar *)0x0;
      local_188.m._0_4_ = 0x1010000;
      local_188.elemSize = (size_t)local_90;
      local_158 = 0xffffffffffffffff;
      local_148 = pMVar4;
      local_e8 = pMVar4;
      cv::filter2D(0,local_150,local_f0,0xffffffff,&local_188,&local_158,4);
      pMVar4 = pMVar4 + 0x60;
    } while (pMVar4 != pMVar1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::green_abi_cxx11_,DAT_001595f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Done",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,color::reset_abi_cxx11_,DAT_00159670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void apply_sharpen(std::vector<cv::Mat> &image_list, float sharpness_val) {
   Mat sharpeningKernel = (Mat_<double>(3,3) << 0, 0, 0, 0, sharpness_val, 0, 0, 0, 0);
   if(sharpness_val != 1)
   {
      sharpeningKernel = (Mat_<double>(3,3) << -1, -1, -1, -1, sharpness_val, -1, -1, -1, -1);
   }
   std::cout << color::blue << "Changing Sharpness : " << color::reset;
   for(auto &img: image_list) {
      filter2D(img, img, -1, sharpeningKernel);
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}